

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  undefined4 in_ECX;
  int in_EDX;
  secp256k1_ge *in_RSI;
  
  secp256k1_ecmult_table_verify(0,0x133b51);
  if (in_EDX < 1) {
    secp256k1_ge_from_storage(in_RSI,(secp256k1_ge_storage *)CONCAT44(in_EDX,in_ECX));
    secp256k1_fe_negate_unchecked(&in_RSI->x,(secp256k1_fe *)CONCAT44(in_EDX,in_ECX),0);
  }
  else {
    secp256k1_ge_from_storage(in_RSI,(secp256k1_ge_storage *)CONCAT44(in_EDX,in_ECX));
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}